

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void updateRangeAffinityStr(Expr *pRight,int n,char *zAff)

{
  char cVar1;
  int iVar2;
  Expr *pExpr;
  ulong uVar3;
  
  if (0 < n) {
    uVar3 = 0;
    do {
      pExpr = sqlite3VectorFieldSubexpr(pRight,(int)uVar3);
      cVar1 = sqlite3CompareAffinity(pExpr,zAff[uVar3]);
      if ((cVar1 == 'A') ||
         (iVar2 = sqlite3ExprNeedsNoAffinityChange(pExpr,zAff[uVar3]), iVar2 != 0)) {
        zAff[uVar3] = 'A';
      }
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return;
}

Assistant:

static void updateRangeAffinityStr(
  Expr *pRight,                   /* RHS of comparison */
  int n,                          /* Number of vector elements in comparison */
  char *zAff                      /* Affinity string to modify */
){
  int i;
  for(i=0; i<n; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pRight, i);
    if( sqlite3CompareAffinity(p, zAff[i])==SQLITE_AFF_BLOB
     || sqlite3ExprNeedsNoAffinityChange(p, zAff[i])
    ){
      zAff[i] = SQLITE_AFF_BLOB;
    }
  }
}